

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_math.cpp
# Opt level: O1

bool pvmath::parallelLine<double>(void)

{
  undefined1 auVar1 [16];
  uint32_t uVar2;
  int iVar3;
  PointBase2D<double> *pPVar4;
  double *pdVar5;
  uint uVar6;
  bool bVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined8 in_XMM4_Qb;
  double denominator;
  PointBase2D<double> point2;
  PointBase2D<double> point1;
  LineBase2D<double> line2;
  LineBase2D<double> line1;
  PointBase2D<double> local_b0;
  PointBase2D<double> local_a0;
  PointBase2D<double> local_90;
  PointBase2D<double> local_80;
  LineBase2D<double> local_70;
  LineBase2D<double> local_50;
  
  uVar2 = Test_Helper::runCount();
  bVar7 = uVar2 == 0;
  if (!bVar7) {
    uVar6 = 0;
    do {
      iVar3 = rand();
      auVar16._0_8_ = (double)(iVar3 % 200000);
      auVar16._8_8_ = in_XMM4_Qb;
      auVar13 = vfmadd213sd_fma(auVar16,ZEXT816(0x3f847ae140000000),ZEXT816(0xc08f400000000000));
      iVar3 = rand();
      auVar9._0_8_ = (double)(iVar3 % 200000);
      auVar9._8_8_ = in_XMM4_Qb;
      auVar9 = vfmadd213sd_fma(auVar9,ZEXT816(0x3f847ae140000000),ZEXT816(0xc08f400000000000));
      local_80.y = auVar9._0_8_;
      local_80.x = auVar13._0_8_;
      iVar3 = rand();
      auVar13._0_8_ = (double)(iVar3 % 200000);
      auVar13._8_8_ = in_XMM4_Qb;
      auVar13 = vfmadd213sd_fma(auVar13,ZEXT816(0x3f847ae140000000),ZEXT816(0xc08f400000000000));
      iVar3 = rand();
      auVar10._0_8_ = (double)(iVar3 % 200000);
      auVar10._8_8_ = in_XMM4_Qb;
      auVar9 = vfmadd213sd_fma(auVar10,ZEXT816(0x3f847ae140000000),ZEXT816(0xc08f400000000000));
      local_90.y = auVar9._0_8_;
      local_90.x = auVar13._0_8_;
      LineBase2D<double>::LineBase2D(&local_50,&local_80,&local_90);
      iVar3 = rand();
      auVar14._0_8_ = (double)(iVar3 % 200000);
      auVar14._8_8_ = in_XMM4_Qb;
      auVar13 = vfmadd213sd_fma(auVar14,ZEXT816(0x3f847ae140000000),ZEXT816(0xc08f400000000000));
      iVar3 = rand();
      auVar11._0_8_ = (double)(iVar3 % 200000);
      auVar11._8_8_ = in_XMM4_Qb;
      auVar9 = vfmadd213sd_fma(auVar11,ZEXT816(0x3f847ae140000000),ZEXT816(0xc08f400000000000));
      bVar8 = (uVar6 & 1) == 0;
      pPVar4 = &local_90;
      if (bVar8) {
        pPVar4 = &local_80;
      }
      local_a0.x = auVar13._0_8_ + pPVar4->x;
      pdVar5 = &local_90.y;
      if (bVar8) {
        pdVar5 = &local_80.y;
      }
      local_a0.y = auVar9._0_8_ + *pdVar5;
      pPVar4 = &local_80;
      if (bVar8) {
        pPVar4 = &local_90;
      }
      local_b0.x = auVar13._0_8_ + pPVar4->x;
      pdVar5 = &local_80.y;
      if (bVar8) {
        pdVar5 = &local_90.y;
      }
      local_b0.y = auVar9._0_8_ + *pdVar5;
      LineBase2D<double>::LineBase2D(&local_70,&local_a0,&local_b0);
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_50._direction.y;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_70._direction.x;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_70._direction.y * local_50._direction.x;
      auVar13 = vfmsub231sd_fma(auVar15,auVar12,auVar1);
      local_a0.x = auVar13._0_8_;
      local_b0.x = 0.0;
      bVar8 = isEqual<double>(&local_a0.x,&local_b0.x,10.0);
      if (!bVar8) {
        return bVar7;
      }
      uVar6 = uVar6 + 1;
      uVar2 = Test_Helper::runCount();
      bVar7 = uVar6 >= uVar2;
    } while (uVar6 < uVar2);
  }
  return bVar7;
}

Assistant:

bool parallelLine()
    {
        for( uint32_t i = 0; i < Unit_Test::runCount(); ++i ) {
            const PointBase2D<_Type> point1( Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ), Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ) );
            const PointBase2D<_Type> point2( Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ), Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ) );
            const LineBase2D<_Type> line1( point1, point2 );

            const PointBase2D<_Type> offset( Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ), Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ) );
            const bool inverse = ( (i % 2) == 0 );
            const LineBase2D<_Type> line2( (inverse ? point1 : point2) + offset, (inverse ? point2 : point1) + offset );
            if ( !line1.isParallel( line2 ) )
                return false;
        }
        return true;
    }